

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsReverse(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pNode;
  int iVar5;
  int *piVar6;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  long *plVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar5 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar12 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
    }
    if (-500 < iVar5) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar5 = pNtk->nTravIds;
  pNtk->nTravIds = iVar5 + 1;
  if (0x3ffffffe < iVar5) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    uVar9 = extraout_RDX;
    do {
      plVar10 = (long *)pVVar8->pArray[lVar13];
      lVar11 = *plVar10;
      uVar2 = *(undefined4 *)(lVar11 + 0xd8);
      iVar5 = (int)plVar10[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar11 + 0xe0),iVar5 + 1,(int)uVar9);
      if (((long)iVar5 < 0) || (*(int *)(lVar11 + 0xe4) <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar11 + 0xe8) + (long)iVar5 * 4) = uVar2;
      if (*(int *)*plVar10 == 1) {
        plVar10 = *(long **)(*(long *)(*(long *)((int *)*plVar10 + 8) + 8) +
                            (long)*(int *)plVar10[6] * 8);
      }
      uVar9 = extraout_RDX_00;
      if (0 < *(int *)((long)plVar10 + 0x2c)) {
        lVar11 = 0;
        do {
          Abc_NtkDfsReverse_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                      (long)*(int *)(plVar10[6] + lVar11 * 4) * 8),vNodes);
          lVar11 = lVar11 + 1;
          uVar9 = extraout_RDX_01;
        } while (lVar11 < *(int *)((long)plVar10 + 0x2c));
      }
      lVar13 = lVar13 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar13 < pVVar8->nSize);
  }
  if ((pNtk->ntkType != ABC_NTK_STRASH) && (pVVar8 = pNtk->vObjs, 0 < pVVar8->nSize)) {
    lVar13 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar8->pArray[lVar13];
      if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
         (iVar5 = Abc_NodeIsConst(pNode), iVar5 != 0)) {
        uVar3 = vNodes->nSize;
        uVar4 = vNodes->nCap;
        if (uVar3 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar4 * 2;
            if (iVar5 <= (int)uVar4) goto LAB_0084a941;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
            }
          }
          vNodes->pArray = ppvVar7;
          vNodes->nCap = iVar5;
        }
LAB_0084a941:
        vNodes->nSize = uVar3 + 1;
        vNodes->pArray[(int)uVar3] = pNode;
      }
      lVar13 = lVar13 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar13 < pVVar8->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverse( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverse_rec( pFanout, vNodes );
    }
    // add constant nodes in the end
    if ( !Abc_NtkIsStrash(pNtk) ) {
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_NodeIsConst(pObj) )
                Vec_PtrPush( vNodes, pObj );
    }
    return vNodes;
}